

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O2

void __thiscall
kratos::ZeroGeneratorInputVisitor::visit(ZeroGeneratorInputVisitor *this,Generator *generator)

{
  size_t *this_00;
  uint uVar1;
  pointer puVar2;
  bool bVar3;
  uint uVar4;
  iterator iVar5;
  _Base_ptr p_Var6;
  uint uVar7;
  undefined1 auVar8 [8];
  __shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *p_Var9;
  iterator __begin3;
  anon_class_32_2_644a8d91 local_148;
  undefined1 local_128 [8];
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  attributes;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  port_names;
  function<void_(unsigned_int,_unsigned_int)> wire_zero;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  bits;
  vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
  children;
  undefined1 auStack_58 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> diff_bits;
  shared_ptr<kratos::Port> port;
  
  std::
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>::
  vector((vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
          *)local_128,&(generator->super_IRNode).attributes_);
  if (local_128 !=
      (undefined1  [8])
      attributes.
      super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      if (local_128 ==
          (undefined1  [8])
          attributes.
          super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
          ._M_impl.super__Vector_impl_data._M_start) goto LAB_00206475;
      bVar3 = std::operator==(&((((pointer)local_128)->
                                super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr)->type_str,"zero_inputs");
      local_128 = (undefined1  [8])((long)local_128 + 0x10);
    } while (!bVar3);
    Generator::get_child_generators
              ((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                *)&bits._M_h._M_single_bucket,generator);
    this_00 = &port_names._M_t._M_impl.super__Rb_tree_header._M_node_count;
    for (p_Var9 = (__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
                  bits._M_h._M_single_bucket;
        p_Var9 != &(children.
                    super__Vector_base<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>;
        p_Var9 = p_Var9 + 1) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&attributes.
                     super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 &(p_Var9->_M_ptr->ports_)._M_t);
      for (p_Var6 = port_names._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var6 != (_Rb_tree_node_base *)&port_names;
          p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
        Generator::get_port((Generator *)
                            &diff_bits.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(string *)p_Var9->_M_ptr);
        if (diff_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage[0x9c] != 1) {
          bits._M_h._M_buckets = (__buckets_ptr)0x1;
          bits._M_h._M_bucket_count = 0;
          bits._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          bits._M_h._M_element_count._0_4_ = 0x3f800000;
          bits._M_h._M_rehash_policy._M_max_load_factor = 0.0;
          bits._M_h._M_rehash_policy._4_4_ = 0;
          bits._M_h._M_rehash_policy._M_next_resize = 0;
          wire_zero._M_invoker = (_Invoker_type)&bits._M_h._M_rehash_policy._M_next_resize;
          bVar3 = connected((shared_ptr<kratos::Port> *)
                            &diff_bits.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,
                            (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)&wire_zero._M_invoker);
          if (!bVar3) {
            auStack_58 = (undefined1  [8])0x0;
            diff_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            diff_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            uVar7 = 0;
            while (port_names._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = uVar7,
                  uVar4 = (**(code **)(*(long *)diff_bits.
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                      0x38))(), uVar7 < uVar4) {
              iVar5 = std::
                      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      ::find((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                              *)&wire_zero._M_invoker,(key_type *)this_00);
              if (iVar5.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0)
              {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)auStack_58,
                           (uint *)this_00);
              }
              uVar7 = (uint)port_names._M_t._M_impl.super__Rb_tree_header._M_node_count + 1;
            }
            uVar7 = *(uint *)auStack_58;
            std::__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)&local_148,
                       (__shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *)
                       &diff_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
            std::__shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_148.gen.
                        super___shared_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2>,p_Var9);
            std::function<void(unsigned_int,unsigned_int)>::
            function<kratos::ZeroGeneratorInputVisitor::visit(kratos::Generator*)::_lambda(unsigned_int,unsigned_int)_1_,void>
                      ((function<void(unsigned_int,unsigned_int)> *)this_00,&local_148);
            visit(kratos::Generator*)::{lambda(unsigned_int,unsigned_int)#1}::~Generator
                      ((_lambda_unsigned_int_unsigned_int__1_ *)&local_148);
            puVar2 = diff_bits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            uVar4 = uVar7;
            for (auVar8 = auStack_58; auVar8 != (undefined1  [8])puVar2;
                auVar8 = (undefined1  [8])((long)auVar8 + 4)) {
              uVar1 = *(uint *)auVar8;
              if (1 < uVar1 - uVar4) {
                std::function<void_(unsigned_int,_unsigned_int)>::operator()
                          ((function<void_(unsigned_int,_unsigned_int)> *)this_00,uVar4,uVar7);
                uVar7 = uVar1;
              }
              uVar4 = uVar1;
            }
            std::function<void_(unsigned_int,_unsigned_int)>::operator()
                      ((function<void_(unsigned_int,_unsigned_int)> *)this_00,uVar4,uVar7);
            std::_Function_base::~_Function_base((_Function_base *)this_00);
            std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                      ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_58);
          }
          std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&wire_zero._M_invoker);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&port);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&attributes.
                      super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::
    vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
    ::~vector((vector<std::shared_ptr<kratos::Generator>,_std::allocator<std::shared_ptr<kratos::Generator>_>_>
               *)&bits._M_h._M_single_bucket);
  }
LAB_00206475:
  std::
  vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           *)local_128);
  return;
}

Assistant:

void visit(Generator* generator) override {
        // we only do that with generator that has attributes called "zero_inputs"
        // we don't care about the values
        auto attributes = generator->get_attributes();
        bool has_attribute = false;
        if (!attributes.empty()) {
            for (auto const& attr : attributes) {
                if (attr->type_str == "zero_inputs") {
                    has_attribute = true;
                    break;
                }
            }
        }
        if (has_attribute) {
            // compute unconnected
            // check each child generator
            auto children = generator->get_child_generators();
            for (auto const& gen : children) {
                auto port_names = gen->get_port_names();
                for (auto const& port_name : port_names) {
                    auto port = gen->get_port(port_name);
                    if (port->port_direction() == PortDirection::Out) continue;
                    std::unordered_set<uint32_t> bits;
                    bool is_connected = connected(port, bits);
                    if (!is_connected) {
                        // notice that we can two choices here:
                        // bit wiring and bulk wiring
                        // we will implement bulk wiring here since the merge wiring pass is not
                        // complete at the time of implementation
                        // compute the set difference
                        std::vector<uint32_t> diff_bits;
                        for (uint32_t i = 0; i < port->width(); i++) {
                            if (bits.find(i) == bits.end()) {
                                // no need to sort the bits since we're going in order
                                // so it's already sorted.
                                diff_bits.emplace_back(i);
                            }
                        }
                        // we will connect the size 1 easily
                        // however, if it's an array and sliced in a weird way, there is nothing
                        // easy we can do. for now we will throw an exception
                        // maximum the slices range
                        uint32_t low = diff_bits[0];
                        uint32_t high = low;
                        uint32_t pre_high = high;

                        // lambda functions to handle the situation
                        std::function<void(uint32_t, uint32_t)> wire_zero = [=](uint32_t h,
                                                                                uint32_t l) {
                            uint32_t ll, hh;
                            if (port->size().size() == 1 && port->size().front() == 1) {
                                ll = l;
                                hh = h;
                            } else {
                                if (l % port->var_width() || (h + 1) % port->var_width()) {
                                    // can't handle it right now
                                    auto stmts = std::vector<Stmt*>();
                                    stmts.reserve(port->sources().size());
                                    for (auto const& stmt : port->sources()) {
                                        stmts.emplace_back(stmt.get());
                                    }
                                    throw StmtException(
                                        "Cannot fix up unpacked array due to irregular slicing",
                                        stmts.begin(), stmts.end());
                                }
                                // compute the low and high
                                ll = l / port->var_width();
                                hh = h / port->var_width();
                            }
                            std::shared_ptr<AssignStmt> stmt;
                            // a special case is that the port is not connected at all!
                            if (ll == 0 && hh == (port->width() - 1)) {
                                stmt = port->assign(constant(0, port->width(), port->is_signed()));
                            } else {
                                auto& slice = port->operator[]({hh, ll});
                                stmt = slice.assign(constant(0, slice.width(), slice.is_signed()));
                            }
                            stmt->fn_name_ln.emplace_back(std::make_pair(__FILE__, __LINE__));
                            gen->add_stmt(stmt);
                        };

                        for (auto const bit : diff_bits) {
                            high = bit;
                            if (high - pre_high > 1) {
                                // there is a gap
                                wire_zero(pre_high, low);
                                low = high;
                                pre_high = low;
                            } else {
                                pre_high = high;
                            }
                        }
                        // the last bit
                        wire_zero(high, low);
                    }
                }
            }
        }
    }